

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O2

client_pipe __thiscall pstore::brokerface::fifo_path::open_impl(fifo_path *this)

{
  errno_erc erc;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  long in_RSI;
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  iVar1 = open(*(char **)(in_RSI + 0x30),0x801);
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = iVar1;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    erc.err_ = *piVar2;
    if ((erc.err_ & 0xfffffffbU) != 2) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = std::operator<<((ostream *)local_190,"Could not open FIFO (");
      poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x30));
      std::operator<<(poVar3,")");
      std::__cxx11::stringbuf::str();
      raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_1b0);
    }
  }
  return (client_pipe)this;
}

Assistant:

auto fifo_path::open_impl () const -> client_pipe {
            auto const & path = get ();

            // select() will return on EOF and for every EOF we handle there will be a new EOF which
            // results in read() calls spinning frantically. To avoid this we open the FIFO for both
            // reading and writing (O_RDWR). This ensures there is at least one writer on the FIFO
            // thus there won't be an EOF and as a result select() won't return unless someone
            // writes to the FIFO.

            client_pipe fdwrite{::open (path.c_str (), O_WRONLY | O_NONBLOCK)}; // NOLINT
            if (fdwrite.native_handle () < 0) {
                int const err = errno;

                // If O_NONBLOCK is specified an open for write-only returns –1 with errno set to
                // ENXIO if no process has the FIFO open for reading. In this event, or if the FIFO
                // wasn't found, return an invalid file descriptor. The caller may want to retry
                // once the service is ready to receive connections.
                if (err != ENOENT && err != ENXIO) {
                    std::ostringstream str;
                    str << "Could not open FIFO (" << path << ")";
                    raise (::pstore::errno_erc{err}, str.str ());
                }
            }
            return fdwrite;
        }